

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrcmap.c
# Opt level: O2

FT_UInt32 pfr_cmap_char_next(PFR_CMap cmap,FT_UInt32 *pchar_code)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt32 FVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = *pchar_code;
  do {
    uVar5 = uVar5 + 1;
    uVar3 = 0;
    uVar2 = cmap->num_chars;
    while( true ) {
      uVar6 = uVar2;
      if (uVar6 < uVar3 || uVar6 - uVar3 == 0) {
        FVar4 = 0;
        uVar5 = 0;
        if (uVar3 != 0 && uVar3 < cmap->num_chars) {
          FVar4 = uVar3 + 1;
          uVar5 = cmap->chars[uVar3].char_code;
        }
        goto LAB_001465d0;
      }
      uVar2 = (uVar6 - uVar3 >> 1) + uVar3;
      uVar1 = cmap->chars[uVar2].char_code;
      if (uVar1 == uVar5) break;
      if (uVar1 < uVar5) {
        uVar3 = uVar2 + 1;
        uVar2 = uVar6;
      }
    }
  } while (uVar2 == 0);
  FVar4 = uVar2 + 1;
LAB_001465d0:
  *pchar_code = uVar5;
  return FVar4;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  pfr_cmap_char_next( PFR_CMap    cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


  Restart:
    {
      FT_UInt   min = 0;
      FT_UInt   max = cmap->num_chars;
      FT_UInt   mid;
      PFR_Char  gchar;


      while ( min < max )
      {
        mid   = min + ( ( max - min ) >> 1 );
        gchar = cmap->chars + mid;

        if ( gchar->char_code == char_code )
        {
          result = mid;
          if ( result != 0 )
          {
            result++;
            goto Exit;
          }

          char_code++;
          goto Restart;
        }

        if ( gchar->char_code < char_code )
          min = mid + 1;
        else
          max = mid;
      }

      /* we didn't find it, but we have a pair just above it */
      char_code = 0;

      if ( min < cmap->num_chars )
      {
        gchar  = cmap->chars + min;
        result = min;
        if ( result != 0 )
        {
          result++;
          char_code = gchar->char_code;
        }
      }
    }

  Exit:
    *pchar_code = char_code;
    return result;
  }